

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  __pid_t _Var1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  AsyncInputStream local_258;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  bool local_228;
  bool local_220;
  Array<char> local_218;
  Fault f;
  char receiveBuffer [7];
  ReadResult result;
  AsyncIoContext ioContext;
  CapabilityPipe pipe3;
  CapabilityPipe pipe2;
  ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> local_c8;
  CapabilityPipe pipe;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receiveStreams [3];
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> result_1;
  ArrayPtr<const_unsigned_char> secondBuf;
  
  setupAsyncIo();
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[2])(&pipe);
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[2])(&pipe2);
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[2])(&pipe3);
  result_1.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>(2);
  local_c8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  (result_1.ptr)->disposer = pipe2.ends[0].disposer;
  (result_1.ptr)->ptr = pipe2.ends[0].ptr;
  pipe2.ends[0].ptr = (AsyncCapabilityStream *)0x0;
  result_1.ptr[1].disposer = pipe3.ends[0].disposer;
  result_1.ptr[1].ptr = pipe3.ends[0].ptr;
  pipe3.ends[0].ptr = (AsyncCapabilityStream *)0x0;
  secondBuf.ptr = "bar";
  secondBuf.size_ = 3;
  result_1.size_ = 2;
  result_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_c8.endPtr = (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)0x0;
  local_c8.ptr = (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)0x0;
  local_c8.pos = (RemoveConst<kj::Own<kj::AsyncCapabilityStream>_> *)0x0;
  (*((pipe.ends[0].ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0x10])
            (&_kjCondition,pipe.ends[0].ptr,&kj::_::ByteLiteral<4ul>,3,&secondBuf,1,&result_1);
  uVar4 = 0x3000002d2;
  pcVar3 = "run";
  Promise<void>::wait((Promise<void> *)&_kjCondition,ioContext.waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::~Array(&result_1);
  receiveBuffer[4] = '\0';
  receiveBuffer[5] = '\0';
  receiveBuffer[6] = '\0';
  receiveBuffer[0] = '\0';
  receiveBuffer[1] = '\0';
  receiveBuffer[2] = '\0';
  receiveBuffer[3] = '\0';
  receiveStreams[2].disposer = (Disposer *)0x0;
  receiveStreams[2].ptr = (AsyncCapabilityStream *)0x0;
  receiveStreams[1].disposer = (Disposer *)0x0;
  receiveStreams[1].ptr = (AsyncCapabilityStream *)0x0;
  receiveStreams[0].disposer = (Disposer *)0x0;
  receiveStreams[0].ptr = (AsyncCapabilityStream *)0x0;
  (*((pipe.ends[1].ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0x11])
            (&_kjCondition,pipe.ends[1].ptr,(Exception *)receiveBuffer,6,7,receiveStreams,3,pcVar3,
             uVar4);
  _Var1 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait
                    ((Promise<kj::AsyncCapabilityStream::ReadResult> *)&_kjCondition,
                     ioContext.waitScope);
  result.byteCount = CONCAT44(extraout_var,_Var1);
  result.capCount = extraout_RDX;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  _kjCondition.left = &result.byteCount;
  _kjCondition.result = result.byteCount == 6;
  _kjCondition.right = 6;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<unsigned_long&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x2da,ERROR,"\"failed: expected \" \"result.byteCount == 6\", _kjCondition",
               (char (*) [39])"failed: expected result.byteCount == 6",&_kjCondition);
  }
  receiveBuffer[6] = '\0';
  strlen(receiveBuffer);
  f.exception = (Exception *)receiveBuffer;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr> *)&f,(char (*) [7])0x42451a);
  if ((local_228 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::StringPtr,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x2dc,ERROR,
               "\"failed: expected \" \"kj::StringPtr(receiveBuffer) == \\\"foobar\\\"\", _kjCondition"
               ,(char (*) [58])"failed: expected kj::StringPtr(receiveBuffer) == \"foobar\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)&_kjCondition);
  }
  _kjCondition.left = &result.capCount;
  _kjCondition.result = result.capCount == 2;
  _kjCondition.right = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    (**((receiveStreams[0].ptr)->super_AsyncIoStream).super_AsyncOutputStream.
       _vptr_AsyncOutputStream)
              (&_kjCondition,&((receiveStreams[0].ptr)->super_AsyncIoStream).super_AsyncOutputStream
               ,&kj::_::ByteLiteral<4ul>,3);
    Promise<void>::wait((Promise<void> *)&_kjCondition,ioContext.waitScope);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(receiveStreams);
    AsyncInputStream::readAllText(&local_258,(uint64_t)pipe2.ends[1].ptr);
    Promise<kj::String>::wait((Promise<kj::String> *)&local_218,&local_258);
    f.exception = (Exception *)local_218.ptr;
    local_218.ptr = (char *)0x0;
    local_218.size_ = 0;
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)&_kjCondition,
               (DebugExpression<kj::String> *)&f,(char (*) [4])0x3f3548);
    Array<char>::~Array((Array<char> *)&f);
    Array<char>::~Array(&local_218);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_258);
    if ((local_220 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[81],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2e2,ERROR,
                 "\"failed: expected \" \"pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \\\"baz\\\"\", _kjCondition"
                 ,(char (*) [81])
                  "failed: expected pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \"baz\""
                 ,(DebugComparison<kj::String,_const_char_(&)[4]> *)&_kjCondition);
    }
    Array<char>::~Array((Array<char> *)&_kjCondition);
    (**((pipe3.ends[1].ptr)->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream)
              (&_kjCondition,&((pipe3.ends[1].ptr)->super_AsyncIoStream).super_AsyncOutputStream,
               &kj::_::ByteLiteral<4ul>,3);
    Promise<void>::wait((Promise<void> *)&_kjCondition,ioContext.waitScope);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(pipe3.ends + 1);
    AsyncInputStream::readAllText(&local_258,(uint64_t)receiveStreams[1].ptr);
    Promise<kj::String>::wait((Promise<kj::String> *)&local_218,&local_258);
    f.exception = (Exception *)local_218.ptr;
    local_218.ptr = (char *)0x0;
    local_218.size_ = 0;
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)&_kjCondition,
               (DebugExpression<kj::String> *)&f,(char (*) [4])0x3fd0a5);
    Array<char>::~Array((Array<char> *)&f);
    Array<char>::~Array(&local_218);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_258);
    if ((local_220 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2e6,ERROR,
                 "\"failed: expected \" \"receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \\\"qux\\\"\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \"qux\""
                 ,(DebugComparison<kj::String,_const_char_(&)[4]> *)&_kjCondition);
    }
    Array<char>::~Array((Array<char> *)&_kjCondition);
    lVar2 = 0x20;
    do {
      Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)
                 ((long)&receiveStreams[0].disposer + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -0x10);
    ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::dispose(&local_c8);
    CapabilityPipe::~CapabilityPipe(&pipe3);
    CapabilityPipe::~CapabilityPipe(&pipe2);
    CapabilityPipe::~CapabilityPipe(&pipe);
    AsyncIoContext::~AsyncIoContext(&ioContext);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,0x2de,FAILED,"result.capCount == 2","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(AsyncIo, CapabilityPipeMultiStreamMessage) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  auto pipe3 = ioContext.provider->newCapabilityPipe();

  auto streams = heapArrayBuilder<Own<AsyncCapabilityStream>>(2);
  streams.add(kj::mv(pipe2.ends[0]));
  streams.add(kj::mv(pipe3.ends[0]));

  ArrayPtr<const byte> secondBuf = "bar"_kjb;
  pipe.ends[0]->writeWithStreams("foo"_kjb, arrayPtr(&secondBuf, 1), streams.finish())
      .wait(ioContext.waitScope);

  char receiveBuffer[7]{};
  Own<AsyncCapabilityStream> receiveStreams[3];
  auto result = pipe.ends[1]->tryReadWithStreams(receiveBuffer, 6, 7, receiveStreams, 3)
      .wait(ioContext.waitScope);

  KJ_EXPECT(result.byteCount == 6);
  receiveBuffer[6] = '\0';
  KJ_EXPECT(kj::StringPtr(receiveBuffer) == "foobar");

  KJ_ASSERT(result.capCount == 2);

  receiveStreams[0]->write("baz"_kjb).wait(ioContext.waitScope);
  receiveStreams[0] = nullptr;
  KJ_EXPECT(pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == "baz");

  pipe3.ends[1]->write("qux"_kjb).wait(ioContext.waitScope);
  pipe3.ends[1] = nullptr;
  KJ_EXPECT(receiveStreams[1]->readAllText().wait(ioContext.waitScope) == "qux");
}